

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_connection.c
# Opt level: O0

int amqp_connection_set_logging(AMQP_CONNECTION_HANDLE conn_handle,_Bool is_trace_on)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  AMQP_CONNECTION_INSTANCE_conflict *instance;
  LOGGER_LOG l;
  int result;
  _Bool is_trace_on_local;
  AMQP_CONNECTION_HANDLE conn_handle_local;
  
  if (conn_handle == (AMQP_CONNECTION_HANDLE)0x0) {
    l._0_4_ = 0x1d5;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                ,"amqp_connection_set_logging",0x1d6,1,
                "amqp_connection_set_logging failed (conn_handle is NULL)");
    }
  }
  else {
    conn_handle->is_trace_on = is_trace_on;
    if ((conn_handle->sasl_io == (XIO_HANDLE)0x0) ||
       (iVar1 = xio_setoption(conn_handle->sasl_io,"logtrace",&conn_handle->is_trace_on), iVar1 == 0
       )) {
      connection_set_trace(conn_handle->connection_handle,(_Bool)(conn_handle->is_trace_on & 1));
      l._0_4_ = 0;
    }
    else {
      l._0_4_ = 0x1e1;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                  ,"amqp_connection_set_logging",0x1e2,1,
                  "amqp_connection_set_logging failed (xio_setoption() failed)");
      }
    }
  }
  return (int)l;
}

Assistant:

int amqp_connection_set_logging(AMQP_CONNECTION_HANDLE conn_handle, bool is_trace_on)
{
    int result;

    if (conn_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("amqp_connection_set_logging failed (conn_handle is NULL)");
    }
    else
    {
        AMQP_CONNECTION_INSTANCE* instance = (AMQP_CONNECTION_INSTANCE*)conn_handle;

        instance->is_trace_on = is_trace_on;

        if (instance->sasl_io != NULL &&
            xio_setoption(instance->sasl_io, SASL_IO_OPTION_LOG_TRACE, (const void*)&instance->is_trace_on) != RESULT_OK)
        {
            result = MU_FAILURE;
            LogError("amqp_connection_set_logging failed (xio_setoption() failed)");
        }
        else
        {
            connection_set_trace(instance->connection_handle, instance->is_trace_on);

            result = RESULT_OK;
        }
    }

    return result;
}